

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void AppendAttribute(cmXMLWriter *xml,char *keyval)

{
  char *local_40;
  string local_38;
  
  local_40 = keyval;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"attribute","");
  cmXMLWriter::StartElement(xml,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char_const*>(xml,"key",&local_40);
  cmXMLWriter::Attribute<char_const*>(xml,"value",&local_40);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

static void AppendAttribute(cmXMLWriter& xml, const char* keyval)
{
  xml.StartElement("attribute");
  xml.Attribute("key", keyval);
  xml.Attribute("value", keyval);
  xml.EndElement();
}